

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)

{
  int iVar1;
  coda_type *local_30;
  char *local_28;
  long index;
  coda_type_record *record;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_30 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_30 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  index = (long)local_30;
  record = (coda_type_record *)cursor;
  if (local_30[1].attributes == (coda_type_record *)0x0) {
    coda_set_error(-0x69,"cursor does not refer to a union");
    cursor_local._4_4_ = -1;
  }
  else {
    iVar1 = coda_ascbin_cursor_get_available_union_field_index(cursor,(long *)&local_28);
    if (iVar1 == 0) {
      record->type_class = record->type_class + coda_array_class;
      (&record->name)[(long)(int)(record->type_class - coda_array_class) * 3] =
           *(char **)(*(long *)(*(long *)(index + 0x50) + (long)local_28 * 8) + 0x10);
      (&record->description)[(long)(int)(record->type_class - coda_array_class) * 3] = local_28;
      (&record->bit_size)[(long)(int)(record->type_class - coda_array_class) * 3] =
           (&record->bit_size)[(long)(int)(record->type_class - coda_integer_class) * 3];
      cursor_local._4_4_ = 0;
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)
{
    coda_type_record *record;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (record->union_field_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a union");
        return -1;
    }

    if (coda_ascbin_cursor_get_available_union_field_index(cursor, &index) != 0)
    {
        return -1;
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    return 0;
}